

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

bool TestConstExpr::NotEqualTest<unsigned_int,short>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  bool bVar1;
  uint7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar2;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffffd4;
  
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)CONCAT44(in_stack_ffffffffffffffd4.m_int,
                           CONCAT13(in_stack_ffffffffffffffd3,
                                    CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0))),
               (int *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  bVar1 = ::operator!=(CONCAT11(in_stack_ffffffffffffffd3,in_stack_ffffffffffffffd2),
                       in_stack_ffffffffffffffd4);
  uVar2 = false;
  if (bVar1) {
    SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                  *)CONCAT44(in_stack_ffffffffffffffd4.m_int,
                             CONCAT13(in_stack_ffffffffffffffd3,
                                      CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0))
                            ),(int *)(ulong)in_stack_ffffffffffffffc8);
    bVar1 = ::operator!=(in_stack_ffffffffffffffd4,
                         CONCAT11(in_stack_ffffffffffffffd3,in_stack_ffffffffffffffd2));
    uVar2 = false;
    if (bVar1) {
      SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
      ::SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                      *)CONCAT44(in_stack_ffffffffffffffd4.m_int,
                                 CONCAT13(in_stack_ffffffffffffffd3,
                                          CONCAT12(in_stack_ffffffffffffffd2,
                                                   in_stack_ffffffffffffffd0))),
                     (int *)(ulong)in_stack_ffffffffffffffc8);
      SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
      SafeInt<int>((SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                    *)CONCAT44(in_stack_ffffffffffffffd4.m_int,
                               CONCAT13(in_stack_ffffffffffffffd3,
                                        CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0
                                                ))),(int *)CONCAT17(uVar2,in_stack_ffffffffffffffc8)
                  );
      rhs.m_int._1_1_ = in_stack_ffffffffffffffd3;
      rhs.m_int._0_1_ = in_stack_ffffffffffffffd2;
      bVar1 = ::operator!=(in_stack_ffffffffffffffd4,rhs);
      uVar2 = false;
      if (bVar1) {
        SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
        ::SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                        *)CONCAT44(in_stack_ffffffffffffffd4.m_int,
                                   CONCAT13(in_stack_ffffffffffffffd3,
                                            CONCAT12(in_stack_ffffffffffffffd2,
                                                     in_stack_ffffffffffffffd0))),
                       (int *)(ulong)in_stack_ffffffffffffffc8);
        bVar1 = ::operator!=((bool)in_stack_ffffffffffffffd3,in_stack_ffffffffffffffd4);
        uVar2 = false;
        if (bVar1) {
          bVar1 = false;
          SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          ::SafeInt<int>((SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                          *)((ulong)in_stack_ffffffffffffffd4.m_int << 0x20),
                         (int *)(ulong)in_stack_ffffffffffffffc8);
          uVar2 = ::operator!=(bVar1,in_stack_ffffffffffffffd4);
        }
      }
    }
  }
  return (bool)uVar2;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}